

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O1

void SCurvePosCtrl_SetNewPos
               (SCurvePosCtrl_t *pSCurvePosCtrl,float cycle,float max_spd,float acc,float finish_pos
               )

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pSCurvePosCtrl->Time = 0.0;
  pSCurvePosCtrl->Cycle = cycle;
  pSCurvePosCtrl->Acc = acc;
  pSCurvePosCtrl->Dec = acc;
  pSCurvePosCtrl->MaxSpd = max_spd;
  pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
  pSCurvePosCtrl->FinishPos = finish_pos;
  pSCurvePosCtrl->DeltaPos = finish_pos - pSCurvePosCtrl->Pos;
  if (0.0001 < ABS(cycle)) {
    SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
    return;
  }
  fVar4 = pSCurvePosCtrl->MaxSpd;
  fVar2 = pSCurvePosCtrl->Spd;
  if (fVar4 <= fVar2) {
    if (fVar4 <= fVar2) {
      pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 = (fVar2 * 0.5 * fVar2) / pSCurvePosCtrl->Acc
      ;
      fVar6 = ((fVar4 * fVar4 - fVar2 * fVar2) * 0.5) / -pSCurvePosCtrl->Acc -
              (fVar4 * 0.5 * fVar4) / pSCurvePosCtrl->Dec;
      lVar1 = 0x48;
      goto LAB_0010bc90;
    }
  }
  else {
    fVar3 = (fVar4 * fVar4 - fVar2 * fVar2) * 0.5;
    fVar6 = (fVar4 * 0.5 * fVar4) / pSCurvePosCtrl->Dec;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 = fVar3 / pSCurvePosCtrl->Acc + fVar6;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1 = (fVar2 * 0.5 * fVar2) / pSCurvePosCtrl->Dec;
    fVar6 = fVar3 / -pSCurvePosCtrl->Acc - fVar6;
    lVar1 = 0x4c;
LAB_0010bc90:
    *(float *)(&pSCurvePosCtrl->Flag + lVar1) = fVar6;
  }
  if (fVar4 <= fVar2) {
    if (fVar2 < fVar4) {
      return;
    }
    fVar6 = pSCurvePosCtrl->DeltaPos;
    if (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 < fVar6) {
      fVar6 = pSCurvePosCtrl->Acc;
      pSCurvePosCtrl->Acc = -fVar6;
      fVar3 = (fVar4 - fVar2) / -fVar6;
      pSCurvePosCtrl->AccTime = fVar3;
      fVar6 = fVar4 / pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->DecTime = fVar6;
      fVar2 = (fVar2 + fVar4) * -0.5 * fVar3 +
              (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos);
      fVar6 = fVar4 * -0.5 * fVar6;
      goto LAB_0010bd6b;
    }
    if ((pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 < fVar6) ||
       (fVar6 <= pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1)) {
      if (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1 < fVar6) {
        return;
      }
      goto LAB_0010be8f;
    }
LAB_0010bdf3:
    fVar6 = pSCurvePosCtrl->Acc;
    fVar3 = pSCurvePosCtrl->Dec;
    pSCurvePosCtrl->Acc = -fVar6;
    pSCurvePosCtrl->Dec = -fVar3;
    pSCurvePosCtrl->MaxSpd = -fVar4;
    fVar2 = fVar2 * fVar2 + (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos) * fVar6 * -2.0;
    fVar4 = fVar3 * fVar3 + fVar6 * fVar3;
  }
  else {
    fVar6 = pSCurvePosCtrl->DeltaPos;
    if (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 < fVar6) {
      fVar3 = (fVar4 - fVar2) / pSCurvePosCtrl->Acc;
      pSCurvePosCtrl->AccTime = fVar3;
      fVar6 = fVar4 / pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->DecTime = fVar6;
      fVar2 = (fVar2 + fVar4) * -0.5 * fVar3 +
              (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos);
      fVar6 = fVar4 * -0.5 * fVar6;
LAB_0010bd6b:
      fVar4 = (fVar6 + fVar2) / fVar4;
      goto LAB_0010be83;
    }
    if ((pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 < fVar6) ||
       (fVar6 <= pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1)) {
      if ((fVar6 <= pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1) &&
         (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition2 < fVar6)) goto LAB_0010bdf3;
      if (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition2 < fVar6) {
        return;
      }
LAB_0010be8f:
      fVar6 = pSCurvePosCtrl->Acc;
      pSCurvePosCtrl->Acc = -fVar6;
      fVar5 = fVar4 / pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->Dec = -pSCurvePosCtrl->Dec;
      fVar3 = -fVar4;
      pSCurvePosCtrl->MaxSpd = fVar3;
      fVar6 = (fVar3 - fVar2) / -fVar6;
      pSCurvePosCtrl->AccTime = fVar6;
      pSCurvePosCtrl->DecTime = fVar5;
      fVar4 = (fVar4 * 0.5 * fVar5 +
              (fVar2 - fVar4) * -0.5 * fVar6 +
              (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos)) / fVar3;
      goto LAB_0010be83;
    }
    fVar4 = pSCurvePosCtrl->Acc;
    fVar6 = pSCurvePosCtrl->Dec;
    fVar2 = fVar2 * fVar2 +
            (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos) * (fVar4 + fVar4);
    fVar4 = fVar6 * fVar6 + fVar4 * fVar6;
  }
  fVar2 = fVar2 / fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar4 = 0.0;
  pSCurvePosCtrl->DecTime = fVar2;
  pSCurvePosCtrl->AccTime =
       (fVar2 * pSCurvePosCtrl->Dec - pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc;
LAB_0010be83:
  pSCurvePosCtrl->MidTime = fVar4;
  return;
}

Assistant:

void SCurvePosCtrl_SetNewPos(SCurvePosCtrl_t *pSCurvePosCtrl, float cycle, float max_spd, float acc, float finish_pos)
{
	pSCurvePosCtrl->Time = 0.0f;
	pSCurvePosCtrl->Cycle = cycle;
	pSCurvePosCtrl->Acc = acc;
	pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->MaxSpd = max_spd;
	pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
	pSCurvePosCtrl->FinishPos = finish_pos;

	pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;

	if (fabs(pSCurvePosCtrl->Cycle) > SCURVE_EQUAL_ERROR)
	{
		SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
	}
	else
	{
		SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
	}
}